

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

char * checkInterfacePropertyCompatibility<char_const*>
                 (cmTarget *tgt,string *p,string *config,char *defaultValue,CompatibleType t,
                 char **param_6)

{
  cmTarget *this;
  bool bVar1;
  char *lhs;
  size_t sVar2;
  iterator iVar3;
  char *pcVar4;
  ostream *poVar5;
  pointer ppcVar6;
  pointer pcVar7;
  char *__s;
  bool bVar8;
  pair<bool,_const_char_*> pVar9;
  string reportEntry;
  string report;
  string interfaceProperty;
  ostringstream e;
  string local_260;
  long *local_240;
  long local_230 [2];
  cmTarget *local_220;
  string local_218;
  _Base_ptr local_1f8;
  _Base_ptr local_1f0;
  _Base_ptr local_1e8;
  _Base_ptr local_1e0;
  vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_> *local_1d8;
  char *local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1d0 = defaultValue;
  lhs = cmTarget::GetProperty(tgt,p,tgt->Makefile);
  local_1e0 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                      *)tgt,p);
  local_1e8 = &(tgt->Properties).
               super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_header;
  bVar8 = local_1e0 != local_1e8;
  local_1f0 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(tgt->LinkImplicitNullProperties)._M_t,p);
  local_1f8 = &(tgt->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (local_1f0 != local_1f8 && bVar8) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmTarget.cxx"
                  ,0x1314,
                  "PropertyType checkInterfacePropertyCompatibility(const cmTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = const char *]"
                 );
  }
  local_1d8 = cmTarget::GetLinkImplementationClosure(tgt,config);
  if ((local_1d8->super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (local_1d8->super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218," * Target \"","");
    std::__cxx11::string::_M_append((char *)&local_218,(ulong)(tgt->Name)._M_dataplus._M_p);
    if (local_1e0 != local_1e8) {
      std::__cxx11::string::append((char *)&local_218);
      pcVar4 = "(unset)";
      if (lhs != (char *)0x0) {
        pcVar4 = lhs;
      }
      local_1a8._0_8_ = local_1a8 + 0x10;
      sVar2 = strlen(pcVar4);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar4,pcVar4 + sVar2);
      std::__cxx11::string::_M_append((char *)&local_218,local_1a8._0_8_);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
    }
    std::__cxx11::string::append((char *)&local_218);
    std::operator+(&local_1c8,"INTERFACE_",p);
    ppcVar6 = (local_1d8->super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    local_220 = tgt;
    if (ppcVar6 !=
        (local_1d8->super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>)._M_impl
        .super__Vector_impl_data._M_finish) {
      do {
        pcVar7 = local_1a8 + 0x10;
        this = *ppcVar6;
        iVar3 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                        *)this,&local_1c8);
        pcVar4 = cmTarget::GetProperty(this,&local_1c8,this->Makefile);
        local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
        local_260._M_string_length = 0;
        local_260.field_2._M_local_buf[0] = '\0';
        if ((_Rb_tree_header *)iVar3._M_node ==
            &(this->Properties).
             super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
             ._M_t._M_impl.super__Rb_tree_header) {
          pcVar4 = lhs;
          if (local_1f0 != local_1f8) {
            pcVar4 = "";
          }
          if (local_1e0 == local_1e8) {
            lhs = pcVar4;
          }
LAB_0031e9fc:
          bVar1 = false;
        }
        else {
          std::__cxx11::string::append((char *)&local_260);
          std::__cxx11::string::_M_append((char *)&local_260,(ulong)(this->Name)._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_260);
          __s = pcVar4;
          if (pcVar4 == (char *)0x0) {
            __s = "(unset)";
          }
          local_1a8._0_8_ = pcVar7;
          sVar2 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,__s,__s + sVar2);
          std::__cxx11::string::_M_append((char *)&local_260,local_1a8._0_8_);
          if ((pointer)local_1a8._0_8_ != pcVar7) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          std::__cxx11::string::append((char *)&local_260);
          if (local_1e0 == local_1e8) {
            if (local_1f0 == local_1f8) {
              if (bVar8) {
                pVar9 = consistentProperty<char_const*>(lhs,pcVar4,t);
                pcVar4 = pVar9.second;
                std::__cxx11::string::_M_append
                          ((char *)&local_218,(ulong)local_260._M_dataplus._M_p);
                compatibilityAgree_abi_cxx11_((string *)local_1a8,t,lhs != pcVar4);
                std::__cxx11::string::_M_append((char *)&local_218,local_1a8._0_8_);
                if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                  operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
                }
                bVar8 = true;
                if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"The INTERFACE_",0xe);
                  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_1a8,(p->_M_dataplus)._M_p,p->_M_string_length
                                     );
                  std::__ostream_insert<char,std::char_traits<char>>(poVar5," property of \"",0xe);
                  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar5,(this->Name)._M_dataplus._M_p,
                                      (this->Name)._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar5,"\" does\nnot agree with the value of ",0x23);
                  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar5,(p->_M_dataplus)._M_p,p->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar5," already determined\nfor \"",0x19);
                  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar5,(local_220->Name)._M_dataplus._M_p,
                                      (local_220->Name)._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".\n",3);
                  std::__cxx11::stringbuf::str();
                  cmSystemTools::Error((char *)local_240,(char *)0x0,(char *)0x0,(char *)0x0);
                  goto LAB_0031ec6b;
                }
              }
              else {
                local_1a8._0_8_ = pcVar7;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_1a8,local_260._M_dataplus._M_p,
                           local_260._M_dataplus._M_p + local_260._M_string_length);
                std::__cxx11::string::append((char *)local_1a8);
                std::__cxx11::string::_M_append((char *)&local_218,local_1a8._0_8_);
                if ((pointer)local_1a8._0_8_ != pcVar7) {
                  operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
                }
                bVar8 = true;
              }
              goto LAB_0031e9c2;
            }
            pVar9 = consistentProperty<char_const*>("",pcVar4,t);
            std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_260._M_dataplus._M_p);
            compatibilityAgree_abi_cxx11_((string *)local_1a8,t,pVar9.second != "");
            std::__cxx11::string::_M_append((char *)&local_218,local_1a8._0_8_);
            pcVar4 = local_1d0;
            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            lhs = pVar9.second;
            if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
            goto LAB_0031e9fc;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Property ",9);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,(p->_M_dataplus)._M_p,p->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," on target \"",0xc);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,(local_220->Name)._M_dataplus._M_p,
                                (local_220->Name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" is\nimplied to be ",0x13);
            if (pcVar4 == (char *)0x0) {
              std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
            }
            else {
              sVar2 = strlen(pcVar4);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar4,sVar2);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,
                       " because it was used to determine the link libraries\nalready. The INTERFACE_"
                       ,0x4c);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,(p->_M_dataplus)._M_p,p->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5," property on\ndependency \"",0x19);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,(this->Name)._M_dataplus._M_p,(this->Name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" is in conflict.\n",0x12);
            std::__cxx11::stringbuf::str();
            cmSystemTools::Error((char *)local_240,(char *)0x0,(char *)0x0,(char *)0x0);
            if (local_240 != local_230) {
              operator_delete(local_240,local_230[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            bVar1 = true;
            lhs = "";
          }
          else {
            pVar9 = consistentProperty<char_const*>(lhs,pcVar4,t);
            pcVar4 = pVar9.second;
            std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_260._M_dataplus._M_p);
            compatibilityAgree_abi_cxx11_((string *)local_1a8,t,lhs != pcVar4);
            std::__cxx11::string::_M_append((char *)&local_218,local_1a8._0_8_);
            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Property ",9)
              ;
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,(p->_M_dataplus)._M_p,p->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5," on target \"",0xc);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar5,(local_220->Name)._M_dataplus._M_p,
                                  (local_220->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar5,"\" does\nnot match the INTERFACE_",0x1f);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar5,(p->_M_dataplus)._M_p,p->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar5," property requirement\nof dependency \"",0x25);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar5,(this->Name)._M_dataplus._M_p,(this->Name)._M_string_length
                                 );
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".\n",3);
              std::__cxx11::stringbuf::str();
              cmSystemTools::Error((char *)local_240,(char *)0x0,(char *)0x0,(char *)0x0);
LAB_0031ec6b:
              if (local_240 != local_230) {
                operator_delete(local_240,local_230[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base(local_138);
              bVar1 = true;
            }
            else {
LAB_0031e9c2:
              bVar1 = false;
              lhs = pcVar4;
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,
                          CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                   local_260.field_2._M_local_buf[0]) + 1);
        }
      } while ((!bVar1) &&
              (ppcVar6 = ppcVar6 + 1,
              ppcVar6 !=
              (local_1d8->super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>).
              _M_impl.super__Vector_impl_data._M_finish));
    }
    pcVar4 = "(unset)";
    if (lhs != (char *)0x0) {
      pcVar4 = lhs;
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    sVar2 = strlen(pcVar4);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar4,pcVar4 + sVar2);
    compatibilityType_abi_cxx11_(&local_260,t);
    cmTarget::ReportPropertyOrigin(local_220,p,(string *)local_1a8,&local_218,&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,
                      CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                               local_260.field_2._M_local_buf[0]) + 1);
    }
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
  }
  return lhs;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmTarget const* tgt,
                                          const std::string &p,
                                          const std::string& config,
                                          const char *defaultValue,
                                          CompatibleType t,
                                          PropertyType *)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);
  const bool explicitlySet = tgt->GetProperties()
                                  .find(p)
                                  != tgt->GetProperties().end();
  const bool impliedByUse =
          tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet)
      || (!impliedByUse && !explicitlySet));

  std::vector<cmTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if(deps.empty())
    {
    return propContent;
    }
  bool propInitialized = explicitlySet;

  std::string report = " * Target \"";
  report += tgt->GetName();
  if (explicitlySet)
    {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
    }
  else if (impliedByUse)
    {
    report += "\" property is implied by use.\n";
    }
  else
    {
    report += "\" property not set.\n";
    }

  std::string interfaceProperty = "INTERFACE_" + p;
  for(std::vector<cmTarget const*>::const_iterator li =
      deps.begin();
      li != deps.end(); ++li)
    {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    cmTarget const* theTarget = *li;

    const bool ifaceIsSet = theTarget->GetProperties()
                            .find(interfaceProperty)
                            != theTarget->GetProperties().end();
    PropertyType ifacePropContent =
                    getTypedProperty<PropertyType>(theTarget,
                              interfaceProperty);

    std::string reportEntry;
    if (ifaceIsSet)
      {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
      }

    if (explicitlySet)
      {
      if (ifaceIsSet)
        {
        std::pair<bool, PropertyType> consistent =
                                  consistentProperty(propContent,
                                                     ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first)
          {
          std::ostringstream e;
          e << "Property " << p << " on target \""
            << tgt->GetName() << "\" does\nnot match the "
            "INTERFACE_" << p << " property requirement\nof "
            "dependency \"" << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str().c_str());
          break;
          }
        else
          {
          propContent = consistent.second;
          continue;
          }
        }
      else
        {
        // Explicitly set on target and not set in iface. Can't disagree.
        continue;
        }
      }
    else if (impliedByUse)
      {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet)
        {
        std::pair<bool, PropertyType> consistent =
                                  consistentProperty(propContent,
                                                     ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first)
          {
          std::ostringstream e;
          e << "Property " << p << " on target \""
            << tgt->GetName() << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_" << p << " property on\ndependency \""
            << theTarget->GetName() << "\" is in conflict.\n";
          cmSystemTools::Error(e.str().c_str());
          break;
          }
        else
          {
          propContent = consistent.second;
          continue;
          }
        }
      else
        {
        // Implicitly set on target and not set in iface. Can't disagree.
        continue;
        }
      }
    else
      {
      if (ifaceIsSet)
        {
        if (propInitialized)
          {
          std::pair<bool, PropertyType> consistent =
                                    consistentProperty(propContent,
                                                       ifacePropContent, t);
          report += reportEntry;
          report += compatibilityAgree(t, propContent != consistent.second);
          if (!consistent.first)
            {
            std::ostringstream e;
            e << "The INTERFACE_" << p << " property of \""
              << theTarget->GetName() << "\" does\nnot agree with the value "
                "of " << p << " already determined\nfor \""
              << tgt->GetName() << "\".\n";
            cmSystemTools::Error(e.str().c_str());
            break;
            }
          else
            {
            propContent = consistent.second;
            continue;
            }
          }
        else
          {
          report += reportEntry + "(Interface set)\n";
          propContent = ifacePropContent;
          propInitialized = true;
          }
        }
      else
        {
        // Not set. Nothing to agree on.
        continue;
        }
      }
    }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}